

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O1

CURLcode tftp_translate_code(tftp_error_t error)

{
  if (error < TFTP_ERR_UNDEF) {
    if (error == TFTP_ERR_NONE) {
      return CURLE_OK;
    }
    if (error == TFTP_ERR_TIMEOUT) {
      return CURLE_OPERATION_TIMEDOUT;
    }
    if (error == TFTP_ERR_NORESPONSE) {
      return CURLE_COULDNT_CONNECT;
    }
  }
  else {
    switch(error) {
    case TFTP_ERR_UNDEF:
    case TFTP_ERR_ILLEGAL:
      return CURLE_TFTP_ILLEGAL;
    case TFTP_ERR_NOTFOUND:
      return CURLE_TFTP_NOTFOUND;
    case TFTP_ERR_PERM:
      return CURLE_TFTP_PERM;
    case TFTP_ERR_DISKFULL:
      return CURLE_REMOTE_DISK_FULL;
    case TFTP_ERR_UNKNOWNID:
      return CURLE_TFTP_UNKNOWNID;
    case TFTP_ERR_EXISTS:
      return CURLE_REMOTE_FILE_EXISTS;
    case TFTP_ERR_NOSUCHUSER:
      return CURLE_TFTP_NOSUCHUSER;
    }
  }
  return CURLE_ABORTED_BY_CALLBACK;
}

Assistant:

static CURLcode tftp_translate_code(tftp_error_t error)
{
  CURLcode result = CURLE_OK;

  if(error != TFTP_ERR_NONE) {
    switch(error) {
    case TFTP_ERR_NOTFOUND:
      result = CURLE_TFTP_NOTFOUND;
      break;
    case TFTP_ERR_PERM:
      result = CURLE_TFTP_PERM;
      break;
    case TFTP_ERR_DISKFULL:
      result = CURLE_REMOTE_DISK_FULL;
      break;
    case TFTP_ERR_UNDEF:
    case TFTP_ERR_ILLEGAL:
      result = CURLE_TFTP_ILLEGAL;
      break;
    case TFTP_ERR_UNKNOWNID:
      result = CURLE_TFTP_UNKNOWNID;
      break;
    case TFTP_ERR_EXISTS:
      result = CURLE_REMOTE_FILE_EXISTS;
      break;
    case TFTP_ERR_NOSUCHUSER:
      result = CURLE_TFTP_NOSUCHUSER;
      break;
    case TFTP_ERR_TIMEOUT:
      result = CURLE_OPERATION_TIMEDOUT;
      break;
    case TFTP_ERR_NORESPONSE:
      result = CURLE_COULDNT_CONNECT;
      break;
    default:
      result = CURLE_ABORTED_BY_CALLBACK;
      break;
    }
  }
  else
    result = CURLE_OK;

  return result;
}